

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.h
# Opt level: O2

void __thiscall benchmark::BenchmarkReporter::Run::~Run(Run *this)

{
  std::__cxx11::string::~string((string *)&this->report_label);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Run() :
      iterations(1),
      real_accumulated_time(0),
      cpu_accumulated_time(0),
      bytes_per_second(0),
      items_per_second(0),
      max_heapbytes_used(0) {}